

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitAndAssign(wasm::Expression*,wasm::IString_
          (void *this,Expression *curr,IString result)

{
  Ref RVar1;
  Value *this_00;
  void *__ptr;
  Ref in_R8;
  IString op;
  
  if (_finalize != result.str._M_str) {
    RVar1 = visit(wasm::Expression*,wasm::IString_(this,curr,result);
    __ptr = (void *)0x18;
    this_00 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    this_00->type = Null;
    cashew::Value::free(this_00,__ptr);
    this_00->type = String;
    (this_00->field_1).str.str._M_len = result.str._M_len;
    (this_00->field_1).str.str._M_str = result.str._M_str;
    op.str._M_str = (char *)RVar1.inst;
    op.str._M_len = BLOCK;
    RVar1 = cashew::ValueBuilder::makeBinary((ValueBuilder *)this_00,cashew::SET,op,in_R8);
    return (Ref)RVar1.inst;
  }
  __assert_fail("result != NO_RESULT",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                ,0x461,
                "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitAndAssign(Expression *, IString)"
               );
}

Assistant:

Ref visitAndAssign(Expression* curr, IString result) {
      assert(result != NO_RESULT);
      Ref ret = visit(curr, result);
      return ValueBuilder::makeStatement(
        ValueBuilder::makeBinary(ValueBuilder::makeName(result), SET, ret));
    }